

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

void * cab_read_ahead_cfdata(archive_read *a,ssize_t *avail)

{
  short sVar1;
  void *pvVar2;
  wchar_t wVar3;
  wchar_t err;
  cab *cab;
  ssize_t *avail_local;
  archive_read *a_local;
  
  pvVar2 = a->format->data;
  wVar3 = cab_next_cfdata(a);
  if (wVar3 < L'\0') {
    *avail = (long)wVar3;
    a_local = (archive_read *)0x0;
  }
  else {
    sVar1 = *(short *)(*(long *)((long)pvVar2 + 0x28) + 6);
    if (sVar1 == 0) {
      a_local = (archive_read *)cab_read_ahead_cfdata_none(a,avail);
    }
    else if (sVar1 == 1) {
      a_local = (archive_read *)cab_read_ahead_cfdata_deflate(a,avail);
    }
    else if (sVar1 == 3) {
      a_local = (archive_read *)cab_read_ahead_cfdata_lzx(a,avail);
    }
    else {
      archive_set_error(&a->archive,0x54,"Unsupported CAB compression : %s",
                        *(undefined8 *)(*(long *)((long)pvVar2 + 0x28) + 0x10));
      *avail = -0x19;
      a_local = (archive_read *)0x0;
    }
  }
  return a_local;
}

Assistant:

static const void *
cab_read_ahead_cfdata(struct archive_read *a, ssize_t *avail)
{
	struct cab *cab = (struct cab *)(a->format->data);
	int err;

	err = cab_next_cfdata(a);
	if (err < ARCHIVE_OK) {
		*avail = err;
		return (NULL);
	}

	switch (cab->entry_cffolder->comptype) {
	case COMPTYPE_NONE:
		return (cab_read_ahead_cfdata_none(a, avail));
	case COMPTYPE_MSZIP:
		return (cab_read_ahead_cfdata_deflate(a, avail));
	case COMPTYPE_LZX:
		return (cab_read_ahead_cfdata_lzx(a, avail));
	default: /* Unsupported compression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported CAB compression : %s",
		    cab->entry_cffolder->compname);
		*avail = ARCHIVE_FAILED;
		return (NULL);
	}
}